

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

void LZ4_renormDictT(LZ4_stream_t_internal *LZ4_dict,BYTE *src)

{
  U32 *pUVar1;
  U32 *pUVar2;
  uint uVar3;
  BYTE *pBVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  uVar8 = LZ4_dict->currentOffset;
  if ((BYTE *)0x80000000 < (BYTE *)(ulong)uVar8 || src < (BYTE *)(ulong)uVar8) {
    pBVar4 = LZ4_dict->dictionary;
    uVar3 = LZ4_dict->dictSize;
    uVar8 = uVar8 - 0x10000;
    lVar9 = 0;
    do {
      pUVar1 = LZ4_dict->hashTable + lVar9;
      uVar5 = pUVar1[1];
      uVar6 = pUVar1[2];
      uVar7 = pUVar1[3];
      pUVar2 = LZ4_dict->hashTable + lVar9;
      *pUVar2 = *pUVar1 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(*pUVar1 ^ 0x80000000));
      pUVar2[1] = uVar5 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar5 ^ 0x80000000));
      pUVar2[2] = uVar6 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
      pUVar2[3] = uVar7 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000));
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x1000);
    LZ4_dict->currentOffset = 0x10000;
    uVar8 = LZ4_dict->dictSize;
    if (0x10000 < uVar8) {
      LZ4_dict->dictSize = 0x10000;
      uVar8 = 0x10000;
    }
    LZ4_dict->dictionary = pBVar4 + ((ulong)uVar3 - (ulong)uVar8);
  }
  return;
}

Assistant:

static void LZ4_renormDictT(LZ4_stream_t_internal* LZ4_dict, const BYTE* src)
{
    if ((LZ4_dict->currentOffset > 0x80000000) ||
        ((size_t)LZ4_dict->currentOffset > (size_t)src))   /* address space overflow */
    {
        /* rescale hash table */
        U32 delta = LZ4_dict->currentOffset - 64 KB;
        const BYTE* dictEnd = LZ4_dict->dictionary + LZ4_dict->dictSize;
        int i;
        for (i=0; i<HASH_SIZE_U32; i++)
        {
            if (LZ4_dict->hashTable[i] < delta) LZ4_dict->hashTable[i]=0;
            else LZ4_dict->hashTable[i] -= delta;
        }
        LZ4_dict->currentOffset = 64 KB;
        if (LZ4_dict->dictSize > 64 KB) LZ4_dict->dictSize = 64 KB;
        LZ4_dict->dictionary = dictEnd - LZ4_dict->dictSize;
    }
}